

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall
irr::gui::CGUISpriteBank::draw2DSpriteBatch
          (CGUISpriteBank *this,array<unsigned_int> *indices,array<irr::core::vector2d<int>_> *pos,
          rect<int> *clip,SColor *color,u32 starttime,u32 currenttime,bool loop,bool center)

{
  pointer *pprVar1;
  long lVar2;
  pointer prVar3;
  vector2d<int> vVar4;
  iterator __position;
  IVideoDriver *pIVar5;
  SColor *pSVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined4 extraout_var;
  pointer pSVar11;
  ulong uVar12;
  pointer pSVar13;
  uint uVar14;
  ulong uVar15;
  u32 new_size;
  ulong uVar16;
  SDrawBatch *element;
  long lVar17;
  rect<int> *__args;
  array<irr::gui::CGUISpriteBank::SDrawBatch> drawBatches;
  position2di p;
  vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
  local_b8;
  undefined1 local_a0;
  array<irr::core::vector2d<int>_> *local_98;
  SColor *local_90;
  rect<int> *local_88;
  array<unsigned_int> *local_80;
  SDrawBatch local_78;
  
  uVar10 = (ulong)((long)(indices->m_data).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(indices->m_data).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  uVar15 = (ulong)((long)(pos->m_data).
                         super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pos->m_data).
                        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((uint)uVar10 < (uint)uVar15) {
    uVar15 = uVar10;
  }
  local_98 = pos;
  local_88 = clip;
  local_80 = indices;
  iVar7 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])();
  if (iVar7 != 0) {
    local_90 = color;
    uVar8 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[2])(this);
    local_b8.
    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a0 = 1;
    ::std::
    vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ::reserve(&local_b8,(ulong)uVar8);
    new_size = (u32)uVar15;
    if ((int)((ulong)((long)(this->Textures).m_data.
                            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->Textures).m_data.
                           super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) != 0) {
      lVar17 = 0;
      uVar10 = 0;
      do {
        local_78.positions.m_data.
        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.positions.m_data.
        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.positions.m_data.
        super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.textureNumber = 0;
        local_78._68_4_ = 0;
        local_78.positions.is_sorted = true;
        local_78.positions._25_7_ = 0;
        local_78.sourceRects.m_data.
        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_78.sourceRects.m_data.
        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.sourceRects.m_data.
        super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.sourceRects.is_sorted = true;
        local_78.sourceRects._25_7_ = 0;
        ::std::
        vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
        ::emplace_back<irr::gui::CGUISpriteBank::SDrawBatch>(&local_b8,&local_78);
        local_a0 = 0;
        if (local_78.sourceRects.m_data.
            super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.sourceRects.m_data.
                          super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.sourceRects.m_data.
                                super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.sourceRects.m_data.
                                super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_78.positions.m_data.
            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.positions.m_data.
                          super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.positions.m_data.
                                super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.positions.m_data.
                                super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        core::array<irr::core::vector2d<int>_>::reallocate
                  ((array<irr::core::vector2d<int>_> *)
                   ((long)&((local_b8.
                             super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                             ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                           super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17),new_size,true);
        core::array<irr::core::rect<int>_>::reallocate
                  ((array<irr::core::rect<int>_> *)
                   ((long)&((local_b8.
                             super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                             ._M_impl.super__Vector_impl_data._M_start)->sourceRects).m_data.
                           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17),new_size,true);
        uVar10 = uVar10 + 1;
        lVar17 = lVar17 + 0x48;
      } while (uVar10 < ((ulong)((long)(this->Textures).m_data.
                                       super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->Textures).m_data.
                                      super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff))
      ;
    }
    pSVar6 = local_90;
    if (new_size != 0) {
      uVar10 = 0;
      do {
        uVar8 = (local_80->m_data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10];
        uVar12 = (ulong)uVar8;
        lVar17 = *(long *)&(this->super_IGUISpriteBank).field_0x8;
        if ((uint)((int)((ulong)(*(long *)&(this->super_IGUISpriteBank).field_0x10 - lVar17) >> 3) *
                  -0x33333333) <= uVar8) goto LAB_0022855f;
        lVar2 = *(long *)(lVar17 + uVar12 * 0x28);
        uVar16 = (ulong)(*(long *)(lVar17 + 8 + uVar12 * 0x28) - lVar2) >> 3;
        uVar8 = (uint)uVar16;
        if (uVar8 == 0) goto LAB_0022855f;
        uVar14 = *(uint *)(lVar17 + uVar12 * 0x28 + 0x20);
        if (uVar14 == 0) {
          uVar14 = 0;
        }
        else {
          uVar12 = (ulong)(currenttime - starttime) / (ulong)uVar14;
          if (loop) {
            uVar14 = (uint)(uVar12 % (uVar16 & 0xffffffff));
          }
          else {
            uVar9 = (uint)uVar12;
            uVar14 = uVar8 - 1;
            if (uVar9 < uVar8) {
              uVar14 = uVar9;
            }
          }
        }
        uVar8 = *(uint *)(lVar2 + (ulong)uVar14 * 8);
        if (uVar8 < (uint)((int)((ulong)((long)local_b8.
                                               super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_b8.
                                              super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          0x38e38e39)) {
          uVar14 = *(uint *)(lVar2 + 4 + (ulong)uVar14 * 8);
          prVar3 = (this->Rectangles).m_data.
                   super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((uint)((ulong)((long)(this->Rectangles).m_data.
                                   super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)prVar3) >> 4)
              <= uVar14) goto LAB_0022855f;
          pSVar11 = local_b8.
                    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar8;
          __args = prVar3 + uVar14;
          if (center) {
            vVar4 = (local_98->m_data).
                    super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar10];
            local_78.positions.m_data.
            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(vVar4.Y - ((__args->LowerRightCorner).Y -
                                             (__args->UpperLeftCorner).Y) / 2,
                                   vVar4.X - ((__args->LowerRightCorner).X -
                                             (__args->UpperLeftCorner).X) / 2);
            element = &local_78;
          }
          else {
            element = (SDrawBatch *)
                      ((local_98->m_data).
                       super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
          }
          core::array<irr::core::vector2d<int>_>::push_back
                    (&pSVar11->positions,(vector2d<int> *)element);
          __position._M_current =
               (pSVar11->sourceRects).m_data.
               super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pSVar11->sourceRects).m_data.
              super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>>::
            _M_realloc_insert<irr::core::rect<int>const&>
                      ((vector<irr::core::rect<int>,std::allocator<irr::core::rect<int>>> *)
                       &pSVar11->sourceRects,__position,__args);
          }
          else {
            vVar4 = __args->LowerRightCorner;
            (__position._M_current)->UpperLeftCorner = __args->UpperLeftCorner;
            (__position._M_current)->LowerRightCorner = vVar4;
            pprVar1 = &(pSVar11->sourceRects).m_data.
                       super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *pprVar1 = *pprVar1 + 1;
          }
          (pSVar11->sourceRects).is_sorted = false;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar15 & 0xffffffff));
    }
    if ((int)((ulong)((long)local_b8.
                            super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_b8.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 != 0) {
      lVar17 = 0x20;
      uVar15 = 0;
      pSVar11 = local_b8.
                super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar13 = local_b8.
                super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        if ((*(long *)((long)pSVar11 + lVar17 + -0x20) != *(long *)((long)pSVar11 + lVar17 + -0x18))
           && (*(long *)((long)&(pSVar11->positions).m_data.
                                super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar17) !=
               *(long *)((long)&(pSVar11->positions).m_data.
                                super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + lVar17))) {
          pIVar5 = this->Driver;
          iVar7 = (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[3])(this,uVar15 & 0xffffffff);
          (*pIVar5->_vptr_IVideoDriver[0x31])
                    (pIVar5,CONCAT44(extraout_var,iVar7),
                     (long)local_b8.
                           super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar17 + -0x20,
                     (long)&((local_b8.
                              super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                              ._M_impl.super__Vector_impl_data._M_start)->positions).m_data.
                            super__Vector_base<irr::core::vector2d<int>,_std::allocator<irr::core::vector2d<int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar17,local_88,
                     (ulong)pSVar6->color,1);
          pSVar11 = local_b8.
                    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar13 = local_b8.
                    super__Vector_base<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar15 = uVar15 + 1;
        lVar17 = lVar17 + 0x48;
      } while (uVar15 < (uint)((int)((ulong)((long)pSVar13 - (long)pSVar11) >> 3) * 0x38e38e39));
    }
LAB_0022855f:
    ::std::
    vector<irr::gui::CGUISpriteBank::SDrawBatch,_std::allocator<irr::gui::CGUISpriteBank::SDrawBatch>_>
    ::~vector(&local_b8);
  }
  return;
}

Assistant:

void CGUISpriteBank::draw2DSpriteBatch(const core::array<u32> &indices,
		const core::array<core::position2di> &pos,
		const core::rect<s32> *clip,
		const video::SColor &color,
		u32 starttime, u32 currenttime,
		bool loop, bool center)
{
	const irr::u32 drawCount = core::min_<u32>(indices.size(), pos.size());

	if (!getTextureCount())
		return;
	core::array<SDrawBatch> drawBatches(getTextureCount());
	for (u32 i = 0; i < Textures.size(); ++i) {
		drawBatches.push_back(SDrawBatch());
		drawBatches[i].positions.reallocate(drawCount);
		drawBatches[i].sourceRects.reallocate(drawCount);
	}

	for (u32 i = 0; i < drawCount; ++i) {
		const u32 index = indices[i];

		// work out frame number
		u32 frame = 0;
		if (!getFrameNr(frame, index, currenttime - starttime, loop))
			return;

		const u32 texNum = Sprites[index].Frames[frame].textureNumber;
		if (texNum >= drawBatches.size()) {
			continue;
		}
		SDrawBatch &currentBatch = drawBatches[texNum];

		const u32 rn = Sprites[index].Frames[frame].rectNumber;
		if (rn >= Rectangles.size())
			return;

		const core::rect<s32> &r = Rectangles[rn];

		if (center) {
			core::position2di p = pos[i];
			p -= r.getSize() / 2;

			currentBatch.positions.push_back(p);
			currentBatch.sourceRects.push_back(r);
		} else {
			currentBatch.positions.push_back(pos[i]);
			currentBatch.sourceRects.push_back(r);
		}
	}

	for (u32 i = 0; i < drawBatches.size(); i++) {
		if (!drawBatches[i].positions.empty() && !drawBatches[i].sourceRects.empty())
			Driver->draw2DImageBatch(getTexture(i), drawBatches[i].positions,
					drawBatches[i].sourceRects, clip, color, true);
	}
}